

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qformlayout.cpp
# Opt level: O3

void __thiscall
QFormLayout::getLayoutPosition(QFormLayout *this,QLayout *layout,int *rowPtr,ItemRole *rolePtr)

{
  int iVar1;
  undefined1 *puVar2;
  int iVar3;
  int index;
  QLayoutItem *pQVar4;
  
  iVar1 = (**(code **)(*(long *)&this->super_QLayout + 200))();
  if (iVar1 < 1) {
    index = 0;
  }
  else {
    pQVar4 = &layout->super_QLayoutItem;
    if (layout == (QLayout *)0x0) {
      pQVar4 = (QLayoutItem *)0x0;
    }
    iVar3 = 0;
    do {
      puVar2 = (undefined1 *)(**(code **)(*(long *)&this->super_QLayout + 0xa8))(this,iVar3);
      index = iVar3;
      if ((QLayoutItem *)puVar2 == pQVar4) break;
      iVar3 = iVar3 + 1;
      index = iVar1;
    } while (iVar1 != iVar3);
  }
  getItemPosition(this,index,rowPtr,rolePtr);
  return;
}

Assistant:

void QFormLayout::getLayoutPosition(QLayout *layout, int *rowPtr, ItemRole *rolePtr) const
{
    int n = count();
    int index = 0;
    while (index < n) {
        if (itemAt(index) == layout)
            break;
        ++index;
    }
    getItemPosition(index, rowPtr, rolePtr);
}